

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  pointer *this_00;
  pointer *this_01;
  size_t sVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  const_iterator __first;
  const_iterator __last;
  int *piVar5;
  ulong uVar6;
  double dVar7;
  anon_class_16_2_577437cb aVar8;
  float local_50c;
  allocator local_479;
  string local_478;
  string local_458 [35];
  byte local_435;
  int local_434;
  _Setw _Stack_430;
  bool skipFirstLinePrefix_1;
  int local_42c;
  int local_428;
  int adjustedLongNamesColumnWidth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  int local_400;
  int local_3fc;
  int shortNamesOverSize;
  int longNamesColumnWidth;
  int shortNamesColumnWidth;
  undefined1 local_3d0 [8];
  string longNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  undefined1 local_388 [8];
  string shortNames;
  undefined1 local_338 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vlongNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vshortNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string desc_1;
  string opts;
  string namesCombined;
  string local_288;
  byte local_265;
  int local_264;
  undefined1 local_260 [3];
  bool skipFirstLinePrefix;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string left;
  stringstream out;
  ostream local_1a0 [383];
  byte local_21;
  Option *pOStack_20;
  bool is_positional_local;
  Option *opt_local;
  Formatter *this_local;
  string *delim;
  
  local_21 = is_positional;
  pOStack_20 = opt;
  opt_local = (Option *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(left.field_2._M_local_buf + 8));
  if ((local_21 & 1) == 0) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])
              ((undefined1 *)((long)&opts.field_2 + 8),this,pOStack_20,0);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])
              ((undefined1 *)((long)&desc_1.field_2 + 8),this,pOStack_20);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])
              (&names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,pOStack_20);
    CLI::detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&vshortNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)((long)&opts.field_2 + 8),',');
    this_00 = &vlongNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_338);
    this_01 = &vshortNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_01);
    aVar8.vlongNames =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_338;
    aVar8.vshortNames =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
    aVar8 = ::std::
            for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_option(CLI::Option_const*,bool)const::_lambda(std::__cxx11::string_const&)_1_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__last._M_current,aVar8);
    delim = (string *)aVar8.vshortNames;
    shortNames.field_2._8_8_ = delim;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_3a8,", ",(allocator *)(longNames.field_2._M_local_buf + 0xf));
    CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_388,
               (detail *)
               &vlongNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3a8,delim);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::allocator<char>::~allocator((allocator<char> *)(longNames.field_2._M_local_buf + 0xf));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&shortNamesColumnWidth,", ",(allocator *)((long)&longNamesColumnWidth + 3))
    ;
    CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_3d0,(detail *)local_338,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&shortNamesColumnWidth,delim);
    ::std::__cxx11::string::~string((string *)&shortNamesColumnWidth);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&longNamesColumnWidth + 3));
    shortNamesOverSize = (int)((this->super_FormatterBase).column_width_ / 3);
    local_50c = (float)(this->super_FormatterBase).column_width_;
    dVar7 = std::ceil((double)(ulong)(uint)(local_50c / 3.0 + local_50c / 3.0));
    local_3fc = (int)SUB84(dVar7,0);
    local_400 = 0;
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ::std::operator+(&local_420,"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388);
      ::std::__cxx11::string::operator=((string *)local_388,(string *)&local_420);
      ::std::__cxx11::string::~string((string *)&local_420);
      uVar4 = ::std::__cxx11::string::empty();
      if (((uVar4 & 1) != 0) && (uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        ::std::__cxx11::string::operator+=
                  ((string *)local_388,(string *)(desc_1.field_2._M_local_buf + 8));
      }
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)local_388,",");
      }
      iVar2 = ::std::__cxx11::string::length();
      if (shortNamesOverSize <= iVar2) {
        ::std::__cxx11::string::operator+=((string *)local_388," ");
        local_400 = ::std::__cxx11::string::length();
        local_400 = local_400 - shortNamesOverSize;
      }
      adjustedLongNamesColumnWidth = (int)std::setw(shortNamesOverSize);
      poVar3 = ::std::operator<<(local_1a0,(_Setw)adjustedLongNamesColumnWidth);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
      ::std::operator<<(poVar3,(string *)local_388);
    }
    else {
      local_428 = (int)std::setw(shortNamesOverSize);
      poVar3 = ::std::operator<<(local_1a0,(_Setw)local_428);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
      ::std::operator<<(poVar3,"");
    }
    piVar5 = std::min<int>(&local_400,&local_3fc);
    local_400 = *piVar5;
    local_42c = local_3fc - local_400;
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)local_3d0,(string *)(desc_1.field_2._M_local_buf + 8));
      }
      iVar2 = ::std::__cxx11::string::length();
      if (local_42c <= iVar2) {
        ::std::__cxx11::string::operator+=((string *)local_3d0," ");
      }
      _Stack_430 = std::setw(local_42c);
      poVar3 = ::std::operator<<(local_1a0,_Stack_430);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
      ::std::operator<<(poVar3,(string *)local_3d0);
    }
    else {
      local_434 = (int)std::setw(local_42c);
      poVar3 = ::std::operator<<(local_1a0,(_Setw)local_434);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
      ::std::operator<<(poVar3,"");
    }
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_435 = 1;
      ::std::__cxx11::stringstream::str();
      uVar6 = ::std::__cxx11::string::length();
      uVar4 = (this->super_FormatterBase).column_width_;
      ::std::__cxx11::string::~string(local_458);
      if (uVar4 < uVar6) {
        ::std::operator<<(local_1a0,'\n');
        local_435 = 0;
      }
      uVar4 = (this->super_FormatterBase).column_width_;
      sVar1 = (this->super_FormatterBase).right_column_width_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_478,uVar4,' ',&local_479);
      CLI::detail::streamOutAsParagraph
                ((ostream *)local_1a0,
                 (string *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar1,&local_478,
                 (bool)(local_435 & 1));
      ::std::__cxx11::string::~string((string *)&local_478);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    ::std::__cxx11::string::~string((string *)local_3d0);
    ::std::__cxx11::string::~string((string *)local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_338);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vlongNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vshortNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)(desc_1.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(opts.field_2._M_local_buf + 8));
  }
  else {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_210,this,pOStack_20,1);
    ::std::operator+(&local_1f0,"  ",&local_210);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])
              ((undefined1 *)((long)&desc.field_2 + 8),this,pOStack_20);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     &local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&desc.field_2 + 8));
    ::std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_210);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(local_260,this,pOStack_20);
    local_264 = (int)std::setw((int)(this->super_FormatterBase).column_width_);
    poVar3 = ::std::operator<<(local_1a0,(_Setw)local_264);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,std::left);
    ::std::operator<<(poVar3,(string *)local_1d0);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_265 = 1;
      uVar4 = ::std::__cxx11::string::length();
      if ((this->super_FormatterBase).column_width_ <= uVar4) {
        ::std::operator<<(local_1a0,'\n');
        local_265 = 0;
      }
      uVar4 = (this->super_FormatterBase).column_width_;
      sVar1 = (this->super_FormatterBase).right_column_width_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_288,uVar4,' ',
                 (allocator *)(namesCombined.field_2._M_local_buf + 0xf));
      CLI::detail::streamOutAsParagraph
                ((ostream *)local_1a0,(string *)local_260,sVar1,&local_288,(bool)(local_265 & 1));
      ::std::__cxx11::string::~string((string *)&local_288);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(namesCombined.field_2._M_local_buf + 0xf));
    }
    ::std::__cxx11::string::~string((string *)local_260);
    ::std::__cxx11::string::~string((string *)local_1d0);
  }
  ::std::operator<<(local_1a0,'\n');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(left.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option(const Option *opt, bool is_positional) const {
    std::stringstream out;
    if(is_positional) {
        const std::string left = "  " + make_option_name(opt, true) + make_option_opts(opt);
        const std::string desc = make_option_desc(opt);
        out << std::setw(static_cast<int>(column_width_)) << std::left << left;

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(left.length() >= column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    } else {
        const std::string namesCombined = make_option_name(opt, false);
        const std::string opts = make_option_opts(opt);
        const std::string desc = make_option_desc(opt);

        // Split all names at comma and sort them into short names and long names
        const auto names = detail::split(namesCombined, ',');
        std::vector<std::string> vshortNames;
        std::vector<std::string> vlongNames;
        std::for_each(names.begin(), names.end(), [&vshortNames, &vlongNames](const std::string &name) {
            if(name.find("--", 0) != std::string::npos)
                vlongNames.push_back(name);
            else
                vshortNames.push_back(name);
        });

        // Assemble short and long names
        std::string shortNames = detail::join(vshortNames, ", ");
        std::string longNames = detail::join(vlongNames, ", ");

        // Calculate setw sizes
        const auto shortNamesColumnWidth = static_cast<int>(column_width_ / 3);  // 33% left for short names
        const auto longNamesColumnWidth = static_cast<int>(std::ceil(
            static_cast<float>(column_width_) / 3.0f * 2.0f));  // 66% right for long names and options, ceil result
        int shortNamesOverSize = 0;

        // Print short names
        if(!shortNames.empty()) {
            shortNames = "  " + shortNames;  // Indent
            if(longNames.empty() && !opts.empty())
                shortNames += opts;  // Add opts if only short names and no long names
            if(!longNames.empty())
                shortNames += ",";
            if(static_cast<int>(shortNames.length()) >= shortNamesColumnWidth) {
                shortNames += " ";
                shortNamesOverSize = static_cast<int>(shortNames.length()) - shortNamesColumnWidth;
            }
            out << std::setw(shortNamesColumnWidth) << std::left << shortNames;
        } else {
            out << std::setw(shortNamesColumnWidth) << std::left << "";
        }

        // Adjust long name column width in case of short names column reaching into long names column
        shortNamesOverSize =
            (std::min)(shortNamesOverSize, longNamesColumnWidth);  // Prevent negative result with unsigned integers
        const auto adjustedLongNamesColumnWidth = longNamesColumnWidth - shortNamesOverSize;

        // Print long names
        if(!longNames.empty()) {
            if(!opts.empty())
                longNames += opts;
            if(static_cast<int>(longNames.length()) >= adjustedLongNamesColumnWidth)
                longNames += " ";

            out << std::setw(adjustedLongNamesColumnWidth) << std::left << longNames;
        } else {
            out << std::setw(adjustedLongNamesColumnWidth) << std::left << "";
        }

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(out.str().length() > column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    }

    out << '\n';
    return out.str();
}